

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O2

int linenoise::getColumns(int ifd,int ofd)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t __n;
  uint uVar4;
  winsize ws;
  char seq [32];
  
  iVar1 = ioctl(1,0x5413,&ws);
  if (ws.ws_col == 0 || iVar1 == -1) {
    iVar1 = getCursorPosition(ifd,ofd);
    uVar4 = 0x50;
    if ((((iVar1 != -1) && (sVar3 = write(ofd,"\x1b[999C",6), sVar3 == 6)) &&
        (uVar2 = getCursorPosition(ifd,ofd), uVar2 != 0xffffffff)) &&
       (uVar4 = uVar2, iVar1 < (int)uVar2)) {
      snprintf(seq,0x20,"\x1b[%dD");
      __n = strlen(seq);
      write(ofd,seq,__n);
    }
  }
  else {
    uVar4 = (uint)ws.ws_col;
  }
  return uVar4;
}

Assistant:

inline int getColumns(int ifd, int ofd) {
#ifdef _WIN32
    CONSOLE_SCREEN_BUFFER_INFO b;

    if (!GetConsoleScreenBufferInfo(hOut, &b)) return 80;
    return b.srWindow.Right - b.srWindow.Left;
#else
    struct winsize ws;

    if (ioctl(1, TIOCGWINSZ, &ws) == -1 || ws.ws_col == 0) {
        /* ioctl() failed. Try to query the terminal itself. */
        int start, cols;

        /* Get the initial position so we can restore it later. */
        start = getCursorPosition(ifd,ofd);
        if (start == -1) goto failed;

        /* Go to right margin and get position. */
        if (write(ofd,"\x1b[999C",6) != 6) goto failed;
        cols = getCursorPosition(ifd,ofd);
        if (cols == -1) goto failed;

        /* Restore position. */
        if (cols > start) {
            char seq[32];
            snprintf(seq,32,"\x1b[%dD",cols-start);
            if (write(ofd,seq,strlen(seq)) == -1) {
                /* Can't recover... */
            }
        }
        return cols;
    } else {
        return ws.ws_col;
    }

failed:
    return 80;
#endif
}